

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZBlock::TNode>::Resize(TPZVec<TPZBlock::TNode> *this,int64_t newsize,TNode *object)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int64_t *piVar4;
  long lVar5;
  TNode *pTVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  TNode *pTVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      pTVar11 = (TNode *)0x0;
    }
    else {
      piVar4 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize * 0x10 | 8)
      ;
      *piVar4 = newsize;
      pTVar11 = (TNode *)(piVar4 + 1);
      pTVar6 = pTVar11;
      do {
        (pTVar6->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TNode_01897ef8;
        pTVar6->pos = 0;
        pTVar6->dim = 0;
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != (TNode *)(piVar4 + newsize * 2 + 1));
    }
    if (newsize <= lVar9) {
      lVar9 = newsize;
    }
    if (lVar9 < 1) {
      lVar7 = 0;
    }
    else {
      pTVar6 = this->fStore;
      lVar5 = 8;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&(pTVar11->super_TPZSavable)._vptr_TPZSavable + lVar5) =
             *(undefined8 *)((long)&(pTVar6->super_TPZSavable)._vptr_TPZSavable + lVar5);
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar9 != lVar7);
    }
    auVar3 = _DAT_014f8350;
    auVar2 = _DAT_014f8340;
    lVar9 = newsize - lVar7;
    if (lVar9 != 0 && lVar7 <= newsize) {
      uVar1._0_4_ = object->pos;
      uVar1._4_4_ = object->dim;
      lVar5 = lVar9 + -1;
      auVar12._8_4_ = (int)lVar5;
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = (int)((ulong)lVar5 >> 0x20);
      piVar8 = &pTVar11[lVar7 + 1].pos;
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_014f8350;
      do {
        auVar13._8_4_ = (int)uVar10;
        auVar13._0_8_ = uVar10;
        auVar13._12_4_ = (int)(uVar10 >> 0x20);
        auVar13 = (auVar13 | auVar2) ^ auVar3;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          *(undefined8 *)(piVar8 + -4) = uVar1;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          *(undefined8 *)piVar8 = uVar1;
        }
        uVar10 = uVar10 + 2;
        piVar8 = piVar8 + 8;
      } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    pTVar6 = this->fStore;
    if (pTVar6 != (TNode *)0x0) {
      lVar9._0_4_ = pTVar6[-1].pos;
      lVar9._4_4_ = pTVar6[-1].dim;
      operator_delete__(&pTVar6[-1].pos,lVar9 << 4 | 8);
      this->fStore = (TNode *)0x0;
    }
    this->fStore = pTVar11;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}